

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O1

int importKeyPair(char *filePath,char *filePIN,CK_SLOT_ID slotID,char *userPIN,char *label,
                 char *objectID,int forceExec,int noPublicKey)

{
  CK_C_Login p_Var1;
  CK_SESSION_HANDLE CVar2;
  size_t objIDLen_00;
  int iVar3;
  size_t sVar4;
  char *objID;
  CK_RV CVar5;
  CK_OBJECT_HANDLE CVar6;
  size_t objIDLen;
  char user_pin_copy [256];
  CK_SESSION_HANDLE local_150;
  char *local_148;
  size_t local_140;
  uchar local_138 [264];
  
  if (label == (char *)0x0) {
    importKeyPair();
  }
  else if (objectID == (char *)0x0) {
    importKeyPair();
  }
  else {
    local_140 = 0;
    local_148 = filePIN;
    sVar4 = strlen(objectID);
    objID = hexStrToBin(objectID,(int)sVar4,&local_140);
    if (objID == (char *)0x0) {
      importKeyPair();
    }
    else {
      CVar5 = (*p11->C_OpenSession)(slotID,6,(void *)0x0,(CK_NOTIFY)0x0,&local_150);
      if (CVar5 == 0) {
        iVar3 = getPW(userPIN,(char *)local_138,1);
        CVar2 = local_150;
        if (iVar3 != 0) {
          importKeyPair();
          return 1;
        }
        p_Var1 = p11->C_Login;
        sVar4 = strlen((char *)local_138);
        CVar5 = (*p_Var1)(CVar2,1,local_138,sVar4);
        objIDLen_00 = local_140;
        if (CVar5 == 0) {
          CVar6 = searchObject(local_150,3,objID,local_140);
          if ((forceExec == 0) && (CVar6 != 0)) {
            importKeyPair();
            return 1;
          }
          crypto_init();
          iVar3 = crypto_import_key_pair
                            (local_150,filePath,local_148,label,objID,objIDLen_00,noPublicKey);
          crypto_final();
          free(objID);
          return iVar3;
        }
        if (CVar5 == 0xa0) {
          importKeyPair();
        }
        else {
          importKeyPair();
        }
      }
      else if (CVar5 == 3) {
        importKeyPair();
      }
      else {
        importKeyPair();
      }
      free(objID);
    }
  }
  return 1;
}

Assistant:

int importKeyPair
(
	char* filePath,
	char* filePIN,
	CK_SLOT_ID slotID,
	char* userPIN,
	char* label,
	char* objectID,
	int forceExec,
	int noPublicKey
)
{
	char user_pin_copy[MAX_PIN_LEN+1];

	if (label == NULL)
	{
		fprintf(stderr, "ERROR: A label for the object must be supplied. "
				"Use --label <text>\n");
		return 1;
	}

	if (objectID == NULL)
	{
		fprintf(stderr, "ERROR: An ID for the object must be supplied. "
				"Use --id <hex>\n");
		return 1;
	}

	size_t objIDLen = 0;
	char* objID = hexStrToBin(objectID, strlen(objectID), &objIDLen);
	if (objID == NULL)
	{
		fprintf(stderr, "Please edit --id <hex> to correct error.\n");
		return 1;
	}

	CK_SESSION_HANDLE hSession;
	CK_RV rv = p11->C_OpenSession(slotID, CKF_SERIAL_SESSION | CKF_RW_SESSION,
					NULL_PTR, NULL_PTR, &hSession);
	if (rv != CKR_OK)
	{
		if (rv == CKR_SLOT_ID_INVALID)
		{
			fprintf(stderr, "ERROR: The given slot does not exist.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not open a session on the given slot.\n");
		}
		free(objID);
		return 1;
	}

	// Get the password
	if (getPW(userPIN, user_pin_copy, CKU_USER) != 0)
	{
		fprintf(stderr, "ERROR: Could not get user PIN\n");
		free(objID);
		return 1;
	}

	rv = p11->C_Login(hSession, CKU_USER, (CK_UTF8CHAR_PTR)user_pin_copy, strlen(user_pin_copy));
	if (rv != CKR_OK)
	{
		if (rv == CKR_PIN_INCORRECT) {
			fprintf(stderr, "ERROR: The given user PIN does not match the one in the token.\n");
		}
		else
		{
			fprintf(stderr, "ERROR: Could not log in on the token.\n");
		}
		free(objID);
		return 1;
	}

	CK_OBJECT_HANDLE oHandle = searchObject(hSession, CKO_PRIVATE_KEY, objID, objIDLen);
	if (oHandle != CK_INVALID_HANDLE && forceExec == 0)
	{
		free(objID);
		fprintf(stderr, "ERROR: The ID is already assigned to another object. "
				"Use --force to override this message.\n");
		return 1;
	}

	crypto_init();
	int result = crypto_import_key_pair(hSession, filePath, filePIN, label, objID, objIDLen, noPublicKey);
	crypto_final();

	free(objID);

	return result;
}